

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

void __thiscall
wasm::WasmBinaryWriter::writeDebugLocation(WasmBinaryWriter *this,DebugLocation *loc)

{
  undefined8 uVar1;
  bool bVar2;
  DebugLocation *local_28;
  size_type local_20;
  size_type offset;
  DebugLocation *loc_local;
  WasmBinaryWriter *this_local;
  
  offset = (size_type)loc;
  loc_local = (DebugLocation *)this;
  bVar2 = Function::DebugLocation::operator==(loc,&this->lastDebugLocation);
  if (!bVar2) {
    local_20 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                         (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>);
    local_28 = (DebugLocation *)offset;
    std::
    vector<std::pair<unsigned_long,wasm::Function::DebugLocation_const*>,std::allocator<std::pair<unsigned_long,wasm::Function::DebugLocation_const*>>>
    ::emplace_back<unsigned_long&,wasm::Function::DebugLocation_const*>
              ((vector<std::pair<unsigned_long,wasm::Function::DebugLocation_const*>,std::allocator<std::pair<unsigned_long,wasm::Function::DebugLocation_const*>>>
                *)&this->sourceMapLocations,&local_20,&local_28);
    uVar1 = *(undefined8 *)offset;
    (this->lastDebugLocation).fileIndex = (int)uVar1;
    (this->lastDebugLocation).lineNumber = (int)((ulong)uVar1 >> 0x20);
    uVar1 = *(undefined8 *)(offset + 8);
    (this->lastDebugLocation).columnNumber = (int)uVar1;
    (this->lastDebugLocation).symbolNameIndex.super__Optional_base<unsigned_int,_true,_true>.
    _M_payload.super__Optional_payload_base<unsigned_int>._M_payload =
         (_Storage<unsigned_int,_true>)(int)((ulong)uVar1 >> 0x20);
    *(undefined4 *)
     &(this->lastDebugLocation).symbolNameIndex.super__Optional_base<unsigned_int,_true,_true>.
      _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged =
         *(undefined4 *)(offset + 0x10);
  }
  return;
}

Assistant:

void WasmBinaryWriter::writeDebugLocation(const Function::DebugLocation& loc) {
  if (loc == lastDebugLocation) {
    return;
  }
  auto offset = o.size();
  sourceMapLocations.emplace_back(offset, &loc);
  lastDebugLocation = loc;
}